

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

StringPtr __thiscall
capnp::compiler::Compiler::Node::joinDisplayName
          (Node *this,Arena *arena,Node *parent,StringPtr declName)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t separatorPos;
  ArrayPtr<char> result;
  Node *parent_local;
  Arena *arena_local;
  StringPtr declName_local;
  
  declName_local.content.ptr = declName.content.ptr;
  result.size_ = (size_t)arena;
  arena_local = (Arena *)parent;
  sVar3 = kj::StringPtr::size((StringPtr *)&arena[2].objectList);
  sVar4 = kj::StringPtr::size((StringPtr *)&arena_local);
  _separatorPos = kj::Arena::allocateArray<char>((Arena *)this,sVar3 + 2 + sVar4);
  sVar3 = kj::StringPtr::size((StringPtr *)(result.size_ + 0x50));
  pcVar5 = kj::ArrayPtr<char>::begin((ArrayPtr<char> *)&separatorPos);
  pcVar6 = kj::StringPtr::begin((StringPtr *)(result.size_ + 0x50));
  memcpy(pcVar5,pcVar6,sVar3);
  bVar1 = kj::Maybe<capnp::compiler::Compiler::Node_&>::operator==
                    ((Maybe<capnp::compiler::Compiler::Node_&> *)(result.size_ + 0x10));
  cVar2 = '.';
  if (bVar1) {
    cVar2 = ':';
  }
  pcVar5 = kj::ArrayPtr<char>::operator[]((ArrayPtr<char> *)&separatorPos,sVar3);
  *pcVar5 = cVar2;
  pcVar5 = kj::ArrayPtr<char>::begin((ArrayPtr<char> *)&separatorPos);
  pcVar6 = kj::StringPtr::begin((StringPtr *)&arena_local);
  sVar4 = kj::StringPtr::size((StringPtr *)&arena_local);
  memcpy(pcVar5 + sVar3 + 1,pcVar6,sVar4);
  sVar3 = kj::ArrayPtr<char>::size((ArrayPtr<char> *)&separatorPos);
  pcVar5 = kj::ArrayPtr<char>::operator[]((ArrayPtr<char> *)&separatorPos,sVar3 - 1);
  *pcVar5 = '\0';
  pcVar5 = kj::ArrayPtr<char>::begin((ArrayPtr<char> *)&separatorPos);
  sVar3 = kj::ArrayPtr<char>::size((ArrayPtr<char> *)&separatorPos);
  kj::StringPtr::StringPtr((StringPtr *)&declName_local.content.size_,pcVar5,sVar3 - 1);
  return (StringPtr)stack0xffffffffffffffe8;
}

Assistant:

kj::StringPtr Compiler::Node::joinDisplayName(
    kj::Arena& arena, Node& parent, kj::StringPtr declName) {
  kj::ArrayPtr<char> result = arena.allocateArray<char>(
      parent.displayName.size() + declName.size() + 2);

  size_t separatorPos = parent.displayName.size();
  memcpy(result.begin(), parent.displayName.begin(), separatorPos);
  result[separatorPos] = parent.parent == kj::none ? ':' : '.';
  memcpy(result.begin() + separatorPos + 1, declName.begin(), declName.size());
  result[result.size() - 1] = '\0';
  return kj::StringPtr(result.begin(), result.size() - 1);
}